

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

LSTMParams * __thiscall CoreML::Specification::LSTMParams::New(LSTMParams *this,Arena *arena)

{
  LSTMParams *this_00;
  
  this_00 = (LSTMParams *)operator_new(0x20);
  LSTMParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::LSTMParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

LSTMParams* LSTMParams::New(::google::protobuf::Arena* arena) const {
  LSTMParams* n = new LSTMParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}